

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O1

int ps_lattice_write(ps_lattice_t *dag,char *filename)

{
  int iVar1;
  ps_latnode_t *ppVar2;
  ps_latnode_t *ppVar3;
  FILE *__s;
  ps_latnode_t *ppVar4;
  char *pcVar5;
  char *pcVar6;
  uint uVar7;
  int iVar8;
  latlink_list_t *plVar9;
  
  ppVar2 = dag->start;
  ppVar3 = dag->end;
  uVar7 = 0;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
          ,0xd9,"Writing lattice file: %s\n",filename);
  __s = fopen(filename,"w");
  if (__s == (FILE *)0x0) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                   ,0xdb,"Failed to open lattice file \'%s\' for writing",filename);
    iVar8 = -1;
  }
  else {
    fwrite("# getcwd: /this/is/bogus\n",0x19,1,__s);
    logmath_get_base(dag->lmath);
    fprintf(__s,"# -logbase %e\n");
    fwrite("#\n",2,1,__s);
    fprintf(__s,"Frames %d\n",(ulong)(uint)dag->n_frames);
    fwrite("#\n",2,1,__s);
    ppVar4 = dag->nodes;
    if (ppVar4 != (ps_latnode_t *)0x0) {
      uVar7 = 0;
      do {
        uVar7 = uVar7 + 1;
        ppVar4 = ppVar4->next;
      } while (ppVar4 != (ps_latnode_s *)0x0);
    }
    fprintf(__s,"Nodes %d (NODEID WORD STARTFRAME FIRST-ENDFRAME LAST-ENDFRAME)\n",(ulong)uVar7);
    ppVar4 = dag->nodes;
    if (ppVar4 != (ps_latnode_t *)0x0) {
      uVar7 = 0;
      do {
        if ((long)ppVar4->wid < 0) {
          pcVar5 = (char *)0x0;
        }
        else {
          pcVar5 = dag->dict->word[ppVar4->wid].word;
        }
        pcVar6 = "(null)";
        if (pcVar5 != (char *)0x0) {
          pcVar6 = pcVar5;
        }
        ppVar4->id = uVar7;
        fprintf(__s,"%d %s %d %d %d ; %d\n",(ulong)uVar7,pcVar6,(ulong)(uint)ppVar4->sf,
                (ulong)(uint)ppVar4->fef,(ulong)(uint)ppVar4->lef,(ulong)(uint)ppVar4->node_id);
        uVar7 = uVar7 + 1;
        ppVar4 = ppVar4->next;
      } while (ppVar4 != (ps_latnode_s *)0x0);
    }
    fwrite("#\n",2,1,__s);
    iVar8 = 0;
    fprintf(__s,"Initial %d\nFinal %d\n",(ulong)(uint)ppVar2->id,(ulong)(uint)ppVar3->id);
    fwrite("#\n",2,1,__s);
    fprintf(__s,"BestSegAscr %d (NODEID ENDFRAME ASCORE)\n",0);
    fwrite("#\n",2,1,__s);
    fwrite("Edges (FROM-NODEID TO-NODEID ASCORE)\n",0x25,1,__s);
    for (ppVar2 = dag->nodes; ppVar2 != (ps_latnode_t *)0x0; ppVar2 = ppVar2->next) {
      for (plVar9 = ppVar2->exits; plVar9 != (latlink_list_t *)0x0; plVar9 = plVar9->next) {
        iVar1 = plVar9->link->ascr;
        if (0xdffffffe < iVar1 - 1U) {
          fprintf(__s,"%d %d %d\n",(ulong)(uint)ppVar2->id,(ulong)(uint)plVar9->link->to->id,
                  (ulong)(uint)(iVar1 << 10));
        }
      }
    }
    fwrite("End\n",4,1,__s);
    fclose(__s);
  }
  return iVar8;
}

Assistant:

int32
ps_lattice_write(ps_lattice_t *dag, char const *filename)
{
    FILE *fp;
    int32 i;
    ps_latnode_t *d, *initial, *final;

    initial = dag->start;
    final = dag->end;

    E_INFO("Writing lattice file: %s\n", filename);
    if ((fp = fopen(filename, "w")) == NULL) {
        E_ERROR_SYSTEM("Failed to open lattice file '%s' for writing", filename);
        return -1;
    }

    /* Stupid Sphinx-III lattice code expects 'getcwd:' here */
    fprintf(fp, "# getcwd: /this/is/bogus\n");
    fprintf(fp, "# -logbase %e\n", logmath_get_base(dag->lmath));
    fprintf(fp, "#\n");

    fprintf(fp, "Frames %d\n", dag->n_frames);
    fprintf(fp, "#\n");

    for (i = 0, d = dag->nodes; d; d = d->next, i++);
    fprintf(fp,
            "Nodes %d (NODEID WORD STARTFRAME FIRST-ENDFRAME LAST-ENDFRAME)\n",
            i);
    for (i = 0, d = dag->nodes; d; d = d->next, i++) {
        const char *word = dict_wordstr(dag->dict, d->wid);
        if (word == NULL)
            word = "(null)";
        d->id = i;
        fprintf(fp, "%d %s %d %d %d ; %d\n",
                i, word,
                d->sf, d->fef, d->lef, d->node_id);
    }
    fprintf(fp, "#\n");

    fprintf(fp, "Initial %d\nFinal %d\n", initial->id, final->id);
    fprintf(fp, "#\n");

    /* Don't bother with this, it's not used by anything. */
    fprintf(fp, "BestSegAscr %d (NODEID ENDFRAME ASCORE)\n",
            0 /* #BPTable entries */ );
    fprintf(fp, "#\n");

    fprintf(fp, "Edges (FROM-NODEID TO-NODEID ASCORE)\n");
    for (d = dag->nodes; d; d = d->next) {
        latlink_list_t *l;
        for (l = d->exits; l; l = l->next) {
            if (l->link->ascr WORSE_THAN WORST_SCORE || l->link->ascr BETTER_THAN 0)
                continue;
            fprintf(fp, "%d %d %d\n",
                    d->id, l->link->to->id, l->link->ascr << SENSCR_SHIFT);
        }
    }
    fprintf(fp, "End\n");
    fclose(fp);

    return 0;
}